

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternEditor.cpp
# Opt level: O0

void __thiscall PatternEditor::transpose(PatternEditor *this)

{
  PatternModel *this_00;
  int iVar1;
  Object local_160 [8];
  undefined8 local_158;
  undefined8 uStack_150;
  code *local_148;
  undefined8 local_140;
  Object local_138 [8];
  QFlags<Qt::AlignmentFlag> local_130;
  QFlags<Qt::AlignmentFlag> local_12c;
  QFlags<Qt::AlignmentFlag> local_128;
  Int local_124;
  QDialogButtonBox local_120 [8];
  QDialogButtonBox buttons;
  QSpinBox local_f8 [8];
  QSpinBox transposeSpin;
  QFlags<Qt::WindowType> local_cc;
  QString local_c8;
  QLabel local_b0 [8];
  QLabel label;
  QVBoxLayout local_88 [8];
  QVBoxLayout layout;
  QString local_58;
  QFlags<Qt::WindowType> local_40;
  Int local_3c;
  QDialog local_38 [8];
  QDialog dialog;
  PatternEditor *this_local;
  
  local_40 = Qt::operator|(WindowTitleHint,WindowSystemMenuHint);
  local_3c = (Int)QFlags<Qt::WindowType>::operator|(&local_40,WindowCloseButtonHint);
  QDialog::QDialog(local_38,(QWidget *)this,(QFlags_conflict1 *)(ulong)local_3c);
  tr(&local_58,"Transpose",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)local_38);
  QString::~QString(&local_58);
  QVBoxLayout::QVBoxLayout(local_88);
  tr(&local_c8,"Enter transpose amount (semitones):",(char *)0x0,-1);
  QFlags<Qt::WindowType>::QFlags(&local_cc);
  QLabel::QLabel(local_b0,(QString *)&local_c8,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_cc.i)
  ;
  QString::~QString(&local_c8);
  QSpinBox::QSpinBox(local_f8,(QWidget *)0x0);
  local_124 = (Int)::operator|(FirstButton,Cancel);
  QDialogButtonBox::QDialogButtonBox(local_120,(QFlags_conflict1 *)(ulong)local_124,(QWidget *)0x0);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_128);
  QBoxLayout::addWidget((QWidget *)local_88,(int)local_b0,(QFlags_conflict1 *)0x0);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_12c);
  QBoxLayout::addWidget((QWidget *)local_88,(int)local_f8,(QFlags_conflict1 *)0x0);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_130);
  QBoxLayout::addWidget((QWidget *)local_88,(int)local_120,(QFlags_conflict1 *)0x0);
  QLayout::setSizeConstraint((SizeConstraint)local_88);
  QWidget::setLayout((QLayout *)local_38);
  QSpinBox::setRange((int)local_f8,-0x53);
  local_148 = QDialogButtonBox::accepted;
  local_140 = 0;
  uStack_150 = 0;
  local_158 = 0x1b9;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_138,(offset_in_QDialogButtonBox_to_subr)local_120,
             (Object *)QDialogButtonBox::accepted,0,(ConnectionType)local_38);
  QMetaObject::Connection::~Connection((Connection *)local_138);
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_160,(offset_in_QDialogButtonBox_to_subr)local_120,
             (Object *)QDialogButtonBox::rejected,0,(ConnectionType)local_38);
  QMetaObject::Connection::~Connection((Connection *)local_160);
  iVar1 = QDialog::exec();
  if (iVar1 == 1) {
    this_00 = this->mModel;
    iVar1 = QSpinBox::value();
    PatternModel::transpose(this_00,iVar1);
  }
  QDialogButtonBox::~QDialogButtonBox(local_120);
  QSpinBox::~QSpinBox(local_f8);
  QLabel::~QLabel(local_b0);
  QVBoxLayout::~QVBoxLayout(local_88);
  QDialog::~QDialog(local_38);
  return;
}

Assistant:

void PatternEditor::transpose() {
    QDialog dialog(this, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint);
    dialog.setWindowTitle(tr("Transpose"));

    QVBoxLayout layout;
        QLabel label(tr("Enter transpose amount (semitones):"));
        QSpinBox transposeSpin;
        QDialogButtonBox buttons(QDialogButtonBox::Ok | QDialogButtonBox::Cancel);
    
    layout.addWidget(&label);
    layout.addWidget(&transposeSpin);
    layout.addWidget(&buttons);
    layout.setSizeConstraint(QLayout::SizeConstraint::SetFixedSize);
    dialog.setLayout(&layout);

    transposeSpin.setRange(-trackerboy::NOTE_LAST, trackerboy::NOTE_LAST);

    connect(&buttons, &QDialogButtonBox::accepted, &dialog, &QDialog::accept);
    connect(&buttons, &QDialogButtonBox::rejected, &dialog, &QDialog::reject);

    if (dialog.exec() == QDialog::Accepted) {
        mModel.transpose(transposeSpin.value());
    }
}